

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O1

void __thiscall winmd::reader::EnumDefinition::EnumDefinition(EnumDefinition *this,TypeDef *type)

{
  undefined4 uVar1;
  unsigned_short uVar2;
  variant_alternative_t<0UL,_variant<ElementType,_coded_index<TypeDefOrRef>,_GenericTypeIndex,_GenericTypeInstSig,_GenericMethodTypeIndex>_>
  *pvVar3;
  uint32_t uVar4;
  bool bVar5;
  Field local_108;
  pair<winmd::reader::Field,_winmd::reader::Field> local_f8;
  FieldSig local_d8;
  
  uVar4 = (type->super_row_base<winmd::reader::TypeDef>).m_index;
  uVar1 = *(undefined4 *)&(type->super_row_base<winmd::reader::TypeDef>).field_0xc;
  (this->m_typedef).super_row_base<winmd::reader::TypeDef>.m_table =
       (type->super_row_base<winmd::reader::TypeDef>).m_table;
  (this->m_typedef).super_row_base<winmd::reader::TypeDef>.m_index = uVar4;
  *(undefined4 *)&(this->m_typedef).super_row_base<winmd::reader::TypeDef>.field_0xc = uVar1;
  this->m_underlying_type = End;
  row_base<winmd::reader::TypeDef>::get_list<winmd::reader::Field>
            (&local_f8,&type->super_row_base<winmd::reader::TypeDef>,4);
  if (local_f8.first.super_row_base<winmd::reader::Field>.m_index !=
      local_f8.second.super_row_base<winmd::reader::Field>.m_index ||
      local_f8.first.super_row_base<winmd::reader::Field>.m_table !=
      local_f8.second.super_row_base<winmd::reader::Field>.m_table) {
    uVar4 = local_f8.first.super_row_base<winmd::reader::Field>.m_index;
    do {
      local_108.super_row_base<winmd::reader::Field>.m_table =
           local_f8.first.super_row_base<winmd::reader::Field>.m_table;
      local_108.super_row_base<winmd::reader::Field>._12_4_ =
           local_f8.first.super_row_base<winmd::reader::Field>._12_4_;
      local_108.super_row_base<winmd::reader::Field>.m_index = uVar4;
      uVar2 = table_base::get_value<unsigned_short>
                        (local_f8.first.super_row_base<winmd::reader::Field>.m_table,uVar4,0);
      if ((uVar2 & 0x40) == 0) {
        uVar2 = table_base::get_value<unsigned_short>
                          (local_108.super_row_base<winmd::reader::Field>.m_table,
                           local_108.super_row_base<winmd::reader::Field>.m_index,0);
        if ((uVar2 & 0x10) == 0) {
          Field::Signature(&local_d8,&local_108);
          pvVar3 = std::
                   get<0ul,winmd::reader::ElementType,winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,winmd::reader::GenericTypeIndex,winmd::reader::GenericTypeInstSig,winmd::reader::GenericMethodTypeIndex>
                             (&local_d8.m_type.m_type);
          this->m_underlying_type = *pvVar3;
          if (local_d8.m_type.m_array_sizes.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.m_type.m_array_sizes.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8.m_type.m_array_sizes.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.m_type.m_array_sizes.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::__detail::__variant::
          _Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
          ::~_Variant_storage((_Variant_storage<false,_winmd::reader::ElementType,_winmd::reader::coded_index<winmd::reader::TypeDefOrRef>,_winmd::reader::GenericTypeIndex,_winmd::reader::GenericTypeInstSig,_winmd::reader::GenericMethodTypeIndex>
                               *)&local_d8.m_type.m_type);
          if (local_d8.m_type.m_cmod.
              super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.m_type.m_cmod.
                            super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.m_type.m_cmod.
                                  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.m_type.m_cmod.
                                  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_d8.m_cmod.
              super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.m_cmod.
                            super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.m_cmod.
                                  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.m_cmod.
                                  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      bVar5 = local_f8.second.super_row_base<winmd::reader::Field>.m_index - 1 != uVar4;
      uVar4 = uVar4 + 1;
    } while (bVar5 || local_f8.first.super_row_base<winmd::reader::Field>.m_table !=
                      local_f8.second.super_row_base<winmd::reader::Field>.m_table);
  }
  return;
}

Assistant:

explicit EnumDefinition(TypeDef const& type)
            : m_typedef(type)
        {
            XLANG_ASSERT(type.is_enum());
            for (auto field : type.FieldList())
            {
                if (!field.Flags().Literal() && !field.Flags().Static())
                {
                    XLANG_ASSERT(m_underlying_type == ElementType::End);
                    m_underlying_type = std::get<ElementType>(field.Signature().Type().Type());
                    XLANG_ASSERT(ElementType::Boolean <= m_underlying_type && m_underlying_type <= ElementType::U8);
                }
            }
        }